

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O1

void __thiscall Pl_DCT::~Pl_DCT(Pl_DCT *this)

{
  ~Pl_DCT(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Pl_DCT::~Pl_DCT() = default;